

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructions.c
# Opt level: O0

int parse_arguments(pExecutor exec,pUserFunction func,Expr *args,int argc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  void *__ptr_00;
  pLongInt pLVar5;
  undefined8 *puVar6;
  Expr EVar7;
  undefined4 uStack_7c;
  int local_70;
  int local_6c;
  int i_1;
  int i;
  Expr rest;
  Expr *def;
  Expr *opt;
  Expr *req;
  int rest_len;
  int opt_len;
  int req_len;
  int rest_pos;
  int opt_pos;
  int argc_local;
  Expr *args_local;
  pUserFunction func_local;
  pExecutor exec_local;
  
  rest_pos = argc;
  _opt_pos = args;
  args_local = (Expr *)func;
  func_local = (pUserFunction)exec;
  iVar4 = scan_arguments(exec,args,argc,&req_len,&opt_len);
  iVar3 = rest_pos;
  iVar2 = req_len;
  iVar1 = opt_len;
  if (iVar4 == 0) {
    exec_local._4_4_ = 0;
  }
  else {
    req._4_4_ = (opt_len - req_len) - VT_ATOM;
    if ((int)req._4_4_ < 0) {
      req._4_4_ = VT_NONE;
    }
    __ptr = malloc((long)req_len << 4);
    if (__ptr == (void *)0x0) {
      printf("parse_arguments: malloc failed\n");
      exec_local._4_4_ = 0;
    }
    else {
      __ptr_00 = malloc((long)(int)req._4_4_ << 4);
      if (__ptr_00 == (void *)0x0) {
        printf("parse_arguments: malloc failed\n");
        free(__ptr);
        exec_local._4_4_ = 0;
      }
      else {
        pLVar5 = (pLongInt)malloc((long)(int)req._4_4_ << 4);
        if (pLVar5 == (pLongInt)0x0) {
          printf("parse_arguments: malloc failed\n");
          free(__ptr);
          free(__ptr_00);
          exec_local._4_4_ = 0;
        }
        else {
          for (local_6c = 0; local_6c < iVar2; local_6c = local_6c + 1) {
            puVar6 = (undefined8 *)((long)__ptr + (long)local_6c * 0x10);
            *puVar6 = *(undefined8 *)(_opt_pos + local_6c);
            *(anon_union_8_8_707b72ea_for_Expr_1 *)(puVar6 + 1) = _opt_pos[local_6c].field_1;
          }
          for (local_70 = 0; local_70 < (int)req._4_4_; local_70 = local_70 + 1) {
            EVar7._4_4_ = 0;
            EVar7.type = _opt_pos[req_len + 1 + local_70].type;
            EVar7.field_1.val_atom = _opt_pos[req_len + 1 + local_70].field_1.val_atom;
            parse_opt_arg((pExecutor)func_local,EVar7,
                          (Expr *)((long)__ptr_00 + (long)local_70 * 0x10),
                          (Expr *)(pLVar5 + (long)local_70 * 2));
          }
          if (iVar3 == iVar1) {
            EVar7 = make_none();
            rest._0_8_ = EVar7.field_1;
            unique0x10000118 = uStack_7c;
            i_1 = EVar7.type;
          }
          else {
            _i_1 = *(anon_union_8_8_707b72ea_for_Expr_1 *)(_opt_pos + (opt_len + 1));
            rest._0_8_ = ((anon_union_8_8_707b72ea_for_Expr_1 *)(_opt_pos + (opt_len + 1)))[1];
          }
          *(void **)args_local = __ptr;
          *(int *)&args_local->field_1 = iVar2;
          *(void **)(args_local + 1) = __ptr_00;
          args_local[1].field_1.val_int = pLVar5;
          args_local[2].type = req._4_4_;
          args_local[2].field_1 = _i_1;
          args_local[3].type = rest.type;
          *(undefined4 *)&args_local[3].field_0x4 = rest._4_4_;
          exec_local._4_4_ = 1;
        }
      }
    }
  }
  return exec_local._4_4_;
}

Assistant:

int parse_arguments(pExecutor exec, pUserFunction func, Expr *args, int argc)
{
    int opt_pos, rest_pos;
    if (!scan_arguments(exec, args, argc, &opt_pos, &rest_pos))
        return 0;

    int req_len = opt_pos;
    int opt_len = rest_pos - opt_pos - 1;
    if (opt_len < 0) opt_len = 0;
    int rest_len = argc - rest_pos;

    Expr *req, *opt, *def, rest;

    req = malloc(req_len * sizeof(Expr));
    if (req == NULL)
    {
        log("parse_arguments: malloc failed");
        return 0;
    }
    opt = malloc(opt_len * sizeof(Expr));
    if (opt == NULL)
    {
        log("parse_arguments: malloc failed");
        free(req);
        return 0;
    }
    def = malloc(opt_len * sizeof(Expr));
    if (def == NULL)
    {
        log("parse_arguments: malloc failed");
        free(req);
        free(opt);
        return 0;
    }

    for (int i = 0; i < req_len; i++)
        req[i] = args[i];
    for (int i = 0; i < opt_len; i++)
        parse_opt_arg(exec, args[opt_pos + 1 + i], opt + i, def + i);
    if (rest_len != 0)
        rest = args[rest_pos + 1];
    else
        rest = make_none();

    func->args = req;
    func->argc = req_len;
    func->opt = opt;
    func->def = def;
    func->optc = opt_len;
    func->rest = rest;

    return 1;
}